

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setFlagOption
          (CommonCore *this,LocalFederateId federateID,int32_t flag,bool flagValue)

{
  string_view message;
  bool bVar1;
  element_type *this_00;
  FederateState *pFVar2;
  undefined8 uVar3;
  byte in_CL;
  int in_EDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ActionMessage cmd;
  FederateState *fed;
  ActionMessage cmd_3;
  ActionMessage cmd_2;
  ActionMessage cmd_1;
  ActionMessage *in_stack_fffffffffffffcb8;
  undefined1 enabled;
  BrokerBase *in_stack_fffffffffffffcc0;
  BrokerBase *this_01;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  action_t in_stack_fffffffffffffcd8;
  action_t in_stack_fffffffffffffcdc;
  FederateState *in_stack_fffffffffffffce0;
  Time in_stack_fffffffffffffcf8;
  LocalFederateId in_stack_fffffffffffffd04;
  ActionMessage local_250;
  undefined1 local_198 [204];
  int local_cc;
  byte local_15;
  int local_14;
  LocalFederateId local_4;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  if ((in_EDX == 0x59) || (in_EDX == 0x58)) {
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    local_cc = local_14;
    if ((local_15 & 1) != 0) {
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                ((ActionMessage *)(local_198 + 200),indicator_flag);
    }
    BrokerBase::addActionMessage(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
  }
  local_198._184_4_ = 0xfffffefd;
  bVar1 = LocalFederateId::operator==(&local_4,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    if (local_14 == 0x2d) {
      if ((local_15 & 1) == 0) {
        this_01 = (BrokerBase *)local_198;
        ActionMessage::ActionMessage
                  ((ActionMessage *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
        local_198._4_4_ = 0x2d;
        BrokerBase::addActionMessage(this_01,in_stack_fffffffffffffcb8);
        ActionMessage::~ActionMessage((ActionMessage *)this_01);
      }
      else {
        std::__atomic_base<short>::operator++
                  ((__atomic_base<short> *)((long)&in_RDI[0x3e]._M_len + 4));
      }
    }
    else if (local_14 == 0x114) {
      this_00 = CLI::std::
                __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4630db);
      enabled = (undefined1)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
      LogManager::getLogBuffer(this_00);
      LogBuffer::enable((LogBuffer *)in_stack_fffffffffffffcc0,(bool)enabled);
    }
    else {
      ActionMessage::ActionMessage
                ((ActionMessage *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      local_250.messageID = local_14;
      if ((local_15 & 1) != 0) {
        setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_250,indicator_flag);
      }
      BrokerBase::addActionMessage(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
    }
  }
  else {
    pFVar2 = getFederateAt((CommonCore *)in_stack_fffffffffffffcf8.internalTimeCode,
                           in_stack_fffffffffffffd04);
    if (pFVar2 == (FederateState *)0x0) {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDI,(char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      message._M_len._4_4_ = in_stack_fffffffffffffcdc;
      message._M_len._0_4_ = in_stack_fffffffffffffcd8;
      message._M_str = (char *)in_stack_fffffffffffffce0;
      InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,message);
      __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    if ((local_15 & 1) != 0) {
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                ((ActionMessage *)&stack0xfffffffffffffcd8,indicator_flag);
    }
    FederateState::setProperties
              (in_stack_fffffffffffffce0,
               (ActionMessage *)CONCAT44(local_14,in_stack_fffffffffffffcd8));
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
  }
  return;
}

Assistant:

void CommonCore::setFlagOption(LocalFederateId federateID, int32_t flag, bool flagValue)
{
    if (flag == defs::Flags::DUMPLOG || flag == defs::Flags::FORCE_LOGGING_FLUSH) {
        ActionMessage cmd(CMD_BASE_CONFIGURE);
        cmd.messageID = flag;
        if (flagValue) {
            setActionFlag(cmd, indicator_flag);
        }
        addActionMessage(cmd);
    }
    if (federateID == gLocalCoreId) {
        switch (flag) {
            case defs::Flags::DELAY_INIT_ENTRY:
                if (flagValue) {
                    ++delayInitCounter;
                } else {
                    ActionMessage cmd(CMD_CORE_CONFIGURE);
                    cmd.messageID = defs::Flags::DELAY_INIT_ENTRY;
                    addActionMessage(cmd);
                }
                break;
            case defs::LOG_BUFFER:
                mLogManager->getLogBuffer().enable(flagValue);
                break;
            default: {
                ActionMessage cmd(CMD_CORE_CONFIGURE);
                cmd.messageID = flag;
                if (flagValue) {
                    setActionFlag(cmd, indicator_flag);
                }
                addActionMessage(cmd);
            } break;
        }
        return;
    }

    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setFlag)"));
    }
    ActionMessage cmd(CMD_FED_CONFIGURE_FLAG);
    cmd.messageID = flag;
    if (flagValue) {
        setActionFlag(cmd, indicator_flag);
    }
    fed->setProperties(cmd);
}